

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::setTabPosition
          (QMainWindowLayout *this,DockWidgetAreas areas,TabPosition tabPosition)

{
  long lVar1;
  Int IVar2;
  undefined4 in_EDX;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  DockPosition dockPositions [4];
  DockWidgetArea dockWidgetAreas [4];
  int iVar3;
  QFlagsStorageHelper<Qt::DockWidgetArea,_4> local_30;
  QMainWindowLayout *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMainWindowLayout *)0x2;
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    local_30.super_QFlagsStorage<Qt::DockWidgetArea>.i =
         (QFlagsStorage<Qt::DockWidgetArea>)
         QFlags<Qt::DockWidgetArea>::operator&
                   ((QFlags<Qt::DockWidgetArea> *)CONCAT44(in_EDX,iVar3),
                    (DockWidgetArea)((ulong)in_RDI >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
    if (IVar2 != 0) {
      *(undefined4 *)
       (in_RDI + 0x764 + (ulong)*(uint *)(&stack0xffffffffffffffd8 + (long)iVar3 * 4) * 4) = in_EDX;
    }
  }
  updateTabBarShapes(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setTabPosition(Qt::DockWidgetAreas areas, QTabWidget::TabPosition tabPosition)
{
    const Qt::DockWidgetArea dockWidgetAreas[] = {
        Qt::TopDockWidgetArea,
        Qt::LeftDockWidgetArea,
        Qt::BottomDockWidgetArea,
        Qt::RightDockWidgetArea
    };
    const QInternal::DockPosition dockPositions[] = {
        QInternal::TopDock,
        QInternal::LeftDock,
        QInternal::BottomDock,
        QInternal::RightDock
    };

    for (int i = 0; i < QInternal::DockCount; ++i)
        if (areas & dockWidgetAreas[i])
            tabPositions[dockPositions[i]] = tabPosition;

    updateTabBarShapes();
}